

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O0

string * __thiscall KMeans::genClusterInitialization(KMeans *this,string *gridName)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  istream *piVar3;
  size_type sVar4;
  long in_RSI;
  Application *in_RDI;
  size_t str;
  stringstream ssLine;
  string line;
  ifstream input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  initList;
  string *returnString;
  value_type *in_stack_ffffffffffffe758;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe768;
  undefined7 in_stack_ffffffffffffe770;
  undefined1 in_stack_ffffffffffffe777;
  undefined7 in_stack_ffffffffffffe780;
  undefined1 in_stack_ffffffffffffe787;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe788;
  Application *this_00;
  string local_1850 [32];
  string local_1830 [32];
  string local_1810 [32];
  string local_17f0 [32];
  string local_17d0 [32];
  string local_17b0 [32];
  string local_1790 [32];
  string local_1770 [32];
  string local_1750 [32];
  string local_1730 [32];
  string local_1710 [32];
  string local_16f0 [32];
  string local_16d0 [32];
  string local_16b0 [32];
  string local_1690 [32];
  string local_1670 [32];
  string local_1650 [32];
  string local_1630 [32];
  size_type local_1610;
  ulong local_1608;
  string local_1600 [39];
  undefined1 local_15d9;
  string local_15d8 [32];
  stringstream local_15b8 [392];
  string local_1430 [36];
  undefined4 local_140c;
  string local_1408 [32];
  string local_13e8 [32];
  string local_13c8 [32];
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [32];
  string local_1048 [32];
  string local_1028 [32];
  string local_1008 [32];
  string local_fe8 [32];
  string local_fc8 [32];
  string local_fa8 [32];
  string local_f88 [32];
  string local_f68 [32];
  string local_f48 [32];
  string local_f28 [32];
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [32];
  string local_ea8 [32];
  string local_e88 [32];
  string local_e68 [32];
  string local_e48 [32];
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [48];
  string local_258 [32];
  long local_238 [65];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [2];
  
  this_00 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x26e036);
  std::operator+(in_stack_ffffffffffffe788,
                 (char *)CONCAT17(in_stack_ffffffffffffe787,in_stack_ffffffffffffe780));
  std::ifstream::ifstream(local_238,local_258,_S_in);
  std::__cxx11::string::~string(local_258);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<((ostream *)&std::cout,"INFO: Looking for cluster initialization file: ");
  std::operator+(in_stack_ffffffffffffe788,
                 (char *)CONCAT17(in_stack_ffffffffffffe787,in_stack_ffffffffffffe780));
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)__rhs,local_288);
  std::ostream::operator<<((ostream *)pbVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_288);
  bVar1 = std::ios::operator!((ios *)((long)local_238 + *(long *)(local_238[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_1430);
    std::__cxx11::stringstream::stringstream(local_15b8);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,local_1430);
      in_stack_ffffffffffffe777 =
           std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!(bool)in_stack_ffffffffffffe777) break;
      in_stack_ffffffffffffe768 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::operator[]((ulong)local_1430);
      if (in_stack_ffffffffffffe768->_M_dataplus != (_Alloc_hider)0x23) {
        std::operator+(pbVar2,(char *)CONCAT17(bVar1,in_stack_ffffffffffffe780));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
        std::__cxx11::string::~string(local_15d8);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_15b8);
    std::__cxx11::string::~string(local_1430);
    local_15d9 = 0;
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    std::__cxx11::string::~string(local_1600);
    local_1608 = 0;
    while( true ) {
      uVar5 = local_1608;
      local_1610 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(local_30);
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::min<unsigned_long>(&local_1610,(unsigned_long *)(in_RSI + 0xa0));
      if (*(ulong *)pbVar2 <= uVar5) break;
      Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
      std::operator+(in_stack_ffffffffffffe768,(char *)pbVar2);
      std::__cxx11::to_string((unsigned_long)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     __rhs);
      std::operator+(in_stack_ffffffffffffe768,(char *)pbVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_30,local_1608);
      std::operator+(in_stack_ffffffffffffe768,pbVar2);
      std::__cxx11::string::operator+=((string *)this_00,local_1630);
      std::__cxx11::string::~string(local_1630);
      std::__cxx11::string::~string(local_1650);
      std::__cxx11::string::~string(local_1670);
      std::__cxx11::string::~string(local_16d0);
      std::__cxx11::string::~string(local_1690);
      std::__cxx11::string::~string(local_16b0);
      local_1608 = local_1608 + 1;
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_30);
    if (sVar4 < *(ulong *)(in_RSI + 0xa0)) {
      Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
      std::operator+(in_stack_ffffffffffffe768,(char *)pbVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(local_30);
      std::__cxx11::to_string((unsigned_long)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     __rhs);
      std::operator+(in_stack_ffffffffffffe768,(char *)pbVar2);
      Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     __rhs);
      std::operator+(in_stack_ffffffffffffe768,(char *)pbVar2);
      std::operator+(in_stack_ffffffffffffe768,pbVar2);
      std::operator+(in_stack_ffffffffffffe768,(char *)pbVar2);
      std::operator+(in_stack_ffffffffffffe768,pbVar2);
      std::operator+(in_stack_ffffffffffffe768,(char *)pbVar2);
      std::__cxx11::string::operator+=((string *)this_00,local_16f0);
      std::__cxx11::string::~string(local_16f0);
      std::__cxx11::string::~string(local_1710);
      std::__cxx11::string::~string(local_1730);
      std::__cxx11::string::~string(local_1750);
      std::__cxx11::string::~string(local_1770);
      std::__cxx11::string::~string(local_1790);
      std::__cxx11::string::~string(local_1850);
      std::__cxx11::string::~string(local_17b0);
      std::__cxx11::string::~string(local_17d0);
      std::__cxx11::string::~string(local_1830);
      std::__cxx11::string::~string(local_17f0);
      std::__cxx11::string::~string(local_1810);
    }
    local_15d9 = 1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"INFO: No cluster initialization file provided. \n");
    std::operator<<((ostream *)&std::cout,"INFO: We will use Kmeans++ Initialization instead. \n");
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,in_stack_ffffffffffffe760);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    Application::offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+(in_stack_ffffffffffffe768,(char *)in_stack_ffffffffffffe760);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_1408);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_13e8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_13c8);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_13a8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string(local_1388);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_1368);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_1348);
    std::__cxx11::string::~string(local_488);
    std::__cxx11::string::~string(local_4a8);
    std::__cxx11::string::~string(local_1328);
    std::__cxx11::string::~string(local_4c8);
    std::__cxx11::string::~string(local_4e8);
    std::__cxx11::string::~string(local_1308);
    std::__cxx11::string::~string(local_508);
    std::__cxx11::string::~string(local_528);
    std::__cxx11::string::~string(local_12e8);
    std::__cxx11::string::~string(local_548);
    std::__cxx11::string::~string(local_568);
    std::__cxx11::string::~string(local_12c8);
    std::__cxx11::string::~string(local_588);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::string::~string(local_12a8);
    std::__cxx11::string::~string(local_5c8);
    std::__cxx11::string::~string(local_5e8);
    std::__cxx11::string::~string(local_1288);
    std::__cxx11::string::~string(local_608);
    std::__cxx11::string::~string(local_628);
    std::__cxx11::string::~string(local_1268);
    std::__cxx11::string::~string(local_648);
    std::__cxx11::string::~string(local_668);
    std::__cxx11::string::~string(local_1248);
    std::__cxx11::string::~string(local_688);
    std::__cxx11::string::~string(local_6a8);
    std::__cxx11::string::~string(local_1228);
    std::__cxx11::string::~string(local_6c8);
    std::__cxx11::string::~string(local_6e8);
    std::__cxx11::string::~string(local_1208);
    std::__cxx11::string::~string(local_708);
    std::__cxx11::string::~string(local_728);
    std::__cxx11::string::~string(local_11e8);
    std::__cxx11::string::~string(local_748);
    std::__cxx11::string::~string(local_768);
    std::__cxx11::string::~string(local_788);
    std::__cxx11::string::~string(local_7a8);
    std::__cxx11::string::~string(local_11c8);
    std::__cxx11::string::~string(local_7c8);
    std::__cxx11::string::~string(local_7e8);
    std::__cxx11::string::~string(local_11a8);
    std::__cxx11::string::~string(local_808);
    std::__cxx11::string::~string(local_828);
    std::__cxx11::string::~string(local_1188);
    std::__cxx11::string::~string(local_848);
    std::__cxx11::string::~string(local_868);
    std::__cxx11::string::~string(local_888);
    std::__cxx11::string::~string(local_8a8);
    std::__cxx11::string::~string(local_1168);
    std::__cxx11::string::~string(local_8c8);
    std::__cxx11::string::~string(local_8e8);
    std::__cxx11::string::~string(local_1148);
    std::__cxx11::string::~string(local_908);
    std::__cxx11::string::~string(local_928);
    std::__cxx11::string::~string(local_1128);
    std::__cxx11::string::~string(local_948);
    std::__cxx11::string::~string(local_968);
    std::__cxx11::string::~string(local_1108);
    std::__cxx11::string::~string(local_988);
    std::__cxx11::string::~string(local_9a8);
    std::__cxx11::string::~string(local_10e8);
    std::__cxx11::string::~string(local_9c8);
    std::__cxx11::string::~string(local_9e8);
    std::__cxx11::string::~string(local_10c8);
    std::__cxx11::string::~string(local_a08);
    std::__cxx11::string::~string(local_a28);
    std::__cxx11::string::~string(local_10a8);
    std::__cxx11::string::~string(local_a48);
    std::__cxx11::string::~string(local_a68);
    std::__cxx11::string::~string(local_1088);
    std::__cxx11::string::~string(local_a88);
    std::__cxx11::string::~string(local_aa8);
    std::__cxx11::string::~string(local_1068);
    std::__cxx11::string::~string(local_ac8);
    std::__cxx11::string::~string(local_ae8);
    std::__cxx11::string::~string(local_1048);
    std::__cxx11::string::~string(local_b08);
    std::__cxx11::string::~string(local_b28);
    std::__cxx11::string::~string(local_1028);
    std::__cxx11::string::~string(local_b48);
    std::__cxx11::string::~string(local_b68);
    std::__cxx11::string::~string(local_1008);
    std::__cxx11::string::~string(local_b88);
    std::__cxx11::string::~string(local_ba8);
    std::__cxx11::string::~string(local_bc8);
    std::__cxx11::string::~string(local_be8);
    std::__cxx11::string::~string(local_fe8);
    std::__cxx11::string::~string(local_c08);
    std::__cxx11::string::~string(local_c28);
    std::__cxx11::string::~string(local_fc8);
    std::__cxx11::string::~string(local_c48);
    std::__cxx11::string::~string(local_c68);
    std::__cxx11::string::~string(local_fa8);
    std::__cxx11::string::~string(local_c88);
    std::__cxx11::string::~string(local_ca8);
    std::__cxx11::string::~string(local_cc8);
    std::__cxx11::string::~string(local_ce8);
    std::__cxx11::string::~string(local_f88);
    std::__cxx11::string::~string(local_d08);
    std::__cxx11::string::~string(local_d28);
    std::__cxx11::string::~string(local_f68);
    std::__cxx11::string::~string(local_d48);
    std::__cxx11::string::~string(local_d68);
    std::__cxx11::string::~string(local_f48);
    std::__cxx11::string::~string(local_d88);
    std::__cxx11::string::~string(local_da8);
    std::__cxx11::string::~string(local_f28);
    std::__cxx11::string::~string(local_dc8);
    std::__cxx11::string::~string(local_de8);
    std::__cxx11::string::~string(local_f08);
    std::__cxx11::string::~string(local_e08);
    std::__cxx11::string::~string(local_e28);
    std::__cxx11::string::~string(local_ee8);
    std::__cxx11::string::~string(local_e48);
    std::__cxx11::string::~string(local_e68);
    std::__cxx11::string::~string(local_ec8);
    std::__cxx11::string::~string(local_e88);
    std::__cxx11::string::~string(local_ea8);
  }
  local_140c = 1;
  std::ifstream::~ifstream(local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffe777,in_stack_ffffffffffffe770));
  return (string *)in_RDI;
}

Assistant:

std::string KMeans::genClusterInitialization(const std::string& gridName)
{
    std::vector<std::string> initList;

    /* Load the cluster initialization file into an input stream. */
    ifstream input(multifaq::dir::PATH_TO_FILES + "/cluster_init.conf");

    std::cout << "INFO: Looking for cluster initialization file: " << multifaq::dir::PATH_TO_FILES + "/cluster_init.conf" << std::endl;

    if (!input)
    {
        std::cout << "INFO: No cluster initialization file provided. \n";
        std::cout << "INFO: We will use Kmeans++ Initialization instead. \n";
        
        return offset(2)+"// Initialize the means\n\n"+
            offset(2)+"std::srand (time(NULL));\n\n"+
	  offset(2)+"double randomVal = (double)(rand() % (size_t)size_of_query_result);\n"+
	  offset(2)+"double count = 0.0;\n"+
	  offset(2)+"size_t pos = 0;\n"+
	  offset(2)+"while (randomVal < count)\n"+
	  offset(2)+"{\n"+
	  offset(3)+"count += "+gridName+"[pos].aggregates[0];\n"+
	  offset(3)+"++pos;\n"+
	  offset(2)+"}\n"+
	  offset(2)+"means[0] = "+gridName+"[pos];\n"+
            // offset(2)+"means[0] = "+gridName+"[rand() % grid_size];\n\n"+
            offset(2)+"std::vector<double> distribution(grid_size,0.0);\n"+
            offset(2)+"for (size_t i = 1; i < k; ++i)\n"+offset(2)+"{\n"+
            offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n"+
            offset(3)+"double dist_sum = 0.0;\n"+
	  offset(3)+"#pragma omp parallel for num_threads(32) private(min_dist,dist) shared(distribution) reduction(+:dist_sum)\n"+
            offset(3)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"min_dist = std::numeric_limits<double>::max();\n"+
            offset(4)+"for (size_t cluster = 0; cluster < i; ++cluster)\n"+
            offset(4)+"{\n"+
            offset(5)+"distance(dist, "+gridName+
            "[tup], means[cluster], cluster, &distance_to_mean[0]);\n"+
            offset(5)+"min_dist = std::min(dist, min_dist);\n"+
            offset(4)+"}\n"+
            offset(4)+"min_dist *= "+gridName+"[tup].aggregates[0];\n"+
            offset(4)+"distribution[tup] = min_dist;\n"+
            offset(4)+"dist_sum += min_dist;\n"+
            offset(3)+"}\n"+
            offset(3)+"distribution[0] /= dist_sum;\n"+
            offset(3)+"for (size_t tup = 1; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"distribution[tup] /= dist_sum;\n"+
            offset(4)+"distribution[tup] += distribution[tup-1];\n"+
            offset(3)+"}\n\n"+
            offset(3)+"// Sample a point...\n"+
            offset(3)+"const double sampleValue = ((double) rand() / (RAND_MAX));\n"+
            offset(3)+"size_t pos = 0;\n"+
            offset(3)+"while (distribution[pos] < sampleValue)\n"+
            offset(4)+"pos++;\n"+
            offset(3)+"means[i] = "+gridName+"[pos];\n"+
            offset(2)+"}\n"+
	  offset(2)+"int64_t endInit = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count()-startProcess;\n"+
	  offset(2)+"startProcess = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();\n";
    }
    else
    {
        /* String and associated stream to receive lines from the file. */
        string line;
        stringstream ssLine;

        while (std::getline(input, line))
        {
            if (line[0] == COMMENT_CHAR)
            {
                continue;
            }
            initList.push_back(line+"\n");
        }
    }

    std::string returnString = offset(2)+"// Initialize the means\n";
    
    for (size_t str = 0; str < std::min(initList.size(), _k); ++str)
    {
        returnString += offset(2)+"means["+std::to_string(str)+"] = "+
            initList[str];
    }
    
    if (initList.size() < _k)
    {
        returnString += offset(2)+"for (size_t cluster = "+
            std::to_string(initList.size())+"; cluster < k; ++cluster)\n"+
            offset(3)+"means[cluster] += "+gridName+"[rand() % "+
            gridName+".size()];\n\n";
    }
    
    return returnString;
}